

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessageFactory::TypeInfo::~TypeInfo(TypeInfo *this)

{
  MessageLite *pMVar1;
  Reflection *this_00;
  bool bVar2;
  int iVar3;
  pointer puVar4;
  uint local_20 [2];
  Descriptor *local_18;
  Descriptor *type;
  TypeInfo *this_local;
  
  pMVar1 = (this->class_data).super_ClassData.prototype;
  type = (Descriptor *)this;
  if (pMVar1 != (MessageLite *)0x0) {
    (*pMVar1->_vptr_MessageLite[1])();
  }
  this_00 = (this->class_data).reflection;
  if (this_00 != (Reflection *)0x0) {
    Reflection::~Reflection(this_00);
    operator_delete(this_00,0x70);
  }
  local_18 = (this->class_data).descriptor;
  bVar2 = std::operator!=(&this->offsets,(nullptr_t)0x0);
  if (bVar2) {
    puVar4 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                       (&this->offsets);
    iVar3 = Descriptor::field_count(local_18);
    local_20[1] = 0xcdcdcdcd;
    std::fill_n<unsigned_int*,int,unsigned_int>(puVar4,iVar3,local_20 + 1);
  }
  bVar2 = std::operator!=(&this->has_bits_indices,(nullptr_t)0x0);
  if (bVar2) {
    puVar4 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                       (&this->has_bits_indices);
    iVar3 = Descriptor::field_count(local_18);
    local_20[0] = 0xcdcdcdcd;
    std::fill_n<unsigned_int*,int,unsigned_int>(puVar4,iVar3,local_20);
  }
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            (&this->has_bits_indices);
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr(&this->offsets)
  ;
  return;
}

Assistant:

~TypeInfo() {
    delete class_data.prototype;
    delete class_data.reflection;

    auto* type = class_data.descriptor;

    // Scribble the payload to prevent unsanitized opt builds from silently
    // allowing use-after-free bugs where the factory is destroyed but the
    // DynamicMessage instances are still used.
    // This is a common bug with DynamicMessageFactory.
    // NOTE: This must happen after deleting the prototype.
    if (offsets != nullptr) {
      std::fill_n(offsets.get(), type->field_count(), 0xCDCDCDCDu);
    }
    if (has_bits_indices != nullptr) {
      std::fill_n(has_bits_indices.get(), type->field_count(), 0xCDCDCDCDu);
    }
  }